

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::sdivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  anon_union_8_2_1313ab2f_for_U local_90;
  uint local_88;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  bVar1 = operator[](LHS,LHS->BitWidth - 1);
  bVar2 = operator[](RHS,RHS->BitWidth - 1);
  if (bVar1) {
    if (bVar2) {
      local_48 = LHS->BitWidth;
      if ((ulong)local_48 < 0x41) {
        local_50 = LHS->U;
      }
      else {
        uVar3 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
        local_50.pVal = (uint64_t *)operator_new__(uVar3);
        memcpy(local_50.pVal,(LHS->U).pVal,uVar3);
      }
      flipAllBits((APInt *)&local_50);
      operator++((APInt *)&local_50);
      local_88 = local_48;
      local_90 = local_50;
      local_48 = 0;
      local_58 = RHS->BitWidth;
      if ((ulong)local_58 < 0x41) {
        local_60 = RHS->U;
      }
      else {
        uVar3 = (ulong)((uint)((ulong)local_58 + 0x3f >> 3) & 0xfffffff8);
        local_60.pVal = (uint64_t *)operator_new__(uVar3);
        memcpy(local_60.pVal,(RHS->U).pVal,uVar3);
      }
      flipAllBits((APInt *)&local_60);
      operator++((APInt *)&local_60);
      local_38 = local_58;
      local_40.VAL = local_60.VAL;
      local_58 = 0;
      udivrem((APInt *)&local_90,(APInt *)&local_40,Quotient,Remainder);
      if ((0x40 < local_38) && (local_40.VAL != 0)) {
        operator_delete__(local_40.pVal);
      }
      if ((0x40 < local_58) && (local_60.VAL != 0)) {
        operator_delete__(local_60.pVal);
      }
      if ((0x40 < local_88) && (local_90.VAL != 0)) {
        operator_delete__(local_90.pVal);
      }
      if ((0x40 < local_48) && (local_50.VAL != 0)) {
        operator_delete__(local_50.pVal);
      }
    }
    else {
      local_68 = LHS->BitWidth;
      if ((ulong)local_68 < 0x41) {
        local_70 = LHS->U;
      }
      else {
        uVar3 = (ulong)((uint)((ulong)local_68 + 0x3f >> 3) & 0xfffffff8);
        local_70.pVal = (uint64_t *)operator_new__(uVar3);
        memcpy(local_70.pVal,(LHS->U).pVal,uVar3);
      }
      flipAllBits((APInt *)&local_70);
      operator++((APInt *)&local_70);
      local_88 = local_68;
      local_90.VAL = local_70.VAL;
      local_68 = 0;
      udivrem((APInt *)&local_90,RHS,Quotient,Remainder);
      if ((0x40 < local_88) && (local_90.VAL != 0)) {
        operator_delete__(local_90.pVal);
      }
      if ((0x40 < local_68) && ((uint64_t *)local_70.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_70.pVal);
      }
      flipAllBits(Quotient);
      operator++(Quotient);
    }
    flipAllBits(Remainder);
  }
  else {
    if (!bVar2) {
      udivrem(LHS,RHS,Quotient,Remainder);
      return;
    }
    local_78 = RHS->BitWidth;
    if ((ulong)local_78 < 0x41) {
      local_80 = RHS->U;
    }
    else {
      uVar3 = (ulong)((uint)((ulong)local_78 + 0x3f >> 3) & 0xfffffff8);
      local_80.pVal = (uint64_t *)operator_new__(uVar3);
      memcpy(local_80.pVal,(RHS->U).pVal,uVar3);
    }
    flipAllBits((APInt *)&local_80);
    operator++((APInt *)&local_80);
    local_88 = local_78;
    local_90.VAL = local_80.VAL;
    local_78 = 0;
    udivrem(LHS,(APInt *)&local_90,Quotient,Remainder);
    if ((0x40 < local_88) && (local_90.VAL != 0)) {
      operator_delete__(local_90.pVal);
    }
    if ((0x40 < local_78) && (local_80.VAL != 0)) {
      operator_delete__(local_80.pVal);
    }
    flipAllBits(Quotient);
    Remainder = Quotient;
  }
  operator++(Remainder);
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  if (LHS.isNegative()) {
    if (RHS.isNegative())
      APInt::udivrem(-LHS, -RHS, Quotient, Remainder);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, Remainder);
      Quotient.negate();
    }
    Remainder.negate();
  } else if (RHS.isNegative()) {
    APInt::udivrem(LHS, -RHS, Quotient, Remainder);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, Remainder);
  }
}